

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvastrscan.c
# Opt level: O0

int kill(__pid_t __pid,int __sig)

{
  uint32_t uVar1;
  int extraout_EAX;
  int j_local;
  
  nv50_graph_reset();
  uVar1 = nva_rd32(cnum,0x40082c);
  if ((uVar1 & 0x800) != 0) {
    printf("Aiiii, xfer is hung. bailing.\n");
    exit(1);
  }
  nva_wr32(cnum,0x400824,0x4001);
  nva_wr32(cnum,0x400828,1);
  nva_wr32(cnum,0x40032c,0x4000);
  nva_wr32(cnum,0x400784,0x4000);
  nva_wr32(cnum,0x400320,4);
  nva_wr32(cnum,0x400324,0);
  nva_wr32(cnum,0x400328,0x200000);
  nva_wr32(cnum,0x400328,0x600007);
  nva_wr32(cnum,0x400328,(__pid & 8U) << 0x10 | 0xc00000 | 1 << ((byte)__pid & 7));
  nva_wr32(cnum,0x400328,0x203000);
  nva_wr32(cnum,0x400328,(__pid & 8U) << 0x10 | 0x800000 | 1 << ((byte)__pid & 7));
  nva_wr32(cnum,0x400328,0x60000c);
  return extraout_EAX;
}

Assistant:

void kill(int j) {
	nv50_graph_reset();
	if (nva_rd32(cnum, 0x40082c) & 0x800) {
		printf("Aiiii, xfer is hung. bailing.\n");
		exit(1);
	}
	nva_wr32(cnum, 0x400824, FLAGS|1);
	nva_wr32(cnum, 0x400828, 1);
	nva_wr32(cnum, 0x40032c, 0x4000);
	nva_wr32(cnum, 0x400784, 0x4000);
	nva_wr32(cnum, 0x400320, 4);

	nva_wr32(cnum, 0x400324, 0);
	nva_wr32(cnum, 0x400328, 0x200000);
	nva_wr32(cnum, 0x400328, 0x600007);
	nva_wr32(cnum, 0x400328, 0xc00000 | (j&8)<<16 | 1<<(j&7));
	nva_wr32(cnum, 0x400328, 0x203000);
	nva_wr32(cnum, 0x400328, 0x800000 | (j&8)<<16 | 1<<(j&7));
	nva_wr32(cnum, 0x400328, 0x60000c);
}